

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O2

bool __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer::
optimizeSetIfWithCopyArm(wasm::Expression___(void *this,Expression **currp)

{
  Name *pNVar1;
  bool bVar2;
  LocalSet *this_00;
  Block *iff;
  Expression *right;
  Builder local_40;
  Builder builder;
  
  this_00 = Expression::cast<wasm::LocalSet>(*currp);
  iff = (Block *)this_00->value;
  if ((((((SpecificExpression<(wasm::Expression::Id)2> *)
         &iff->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression)._id == IfId) &&
      (1 < (((SpecificExpression<(wasm::Expression::Id)2> *)
            &iff->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression).type.id)) &&
     (1 < (((Expression *)(iff->name).super_IString.str._M_len)->type).id)) {
    local_40.wasm = *(Module **)((long)this + 0xd0);
    right = (Expression *)(iff->name).super_IString.str._M_str;
    if ((right->_id == LocalGetId) && (right[1]._id == this_00->index)) {
      Builder::flip(&local_40,(If *)iff);
    }
    else {
      right = (Expression *)
              (iff->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
              .data;
      if ((right->_id != LocalGetId) || (right[1]._id != this_00->index)) goto LAB_00957474;
    }
    builder.wasm._7_1_ = LocalSet::isTee(this_00);
    if (this_00->index != right[1]._id) {
      __assert_fail("set->index == get->index",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                    ,0x521,
                    "bool wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::optimizeSetIfWithCopyArm(Expression **)"
                   );
    }
    if ((Expression *)
        (iff->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
        != right) {
      __assert_fail("iff->ifFalse == get",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                    ,0x522,
                    "bool wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::optimizeSetIfWithCopyArm(Expression **)"
                   );
    }
    pNVar1 = &iff->name;
    this_00->value = (Expression *)(iff->name).super_IString.str._M_str;
    LocalSet::finalize(this_00);
    (iff->name).super_IString.str._M_str = (char *)this_00;
    (iff->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
         (Expression **)0x0;
    If::finalize((If *)iff);
    if (builder.wasm._7_1_ != '\0') {
      LocalSet::makeSet(this_00);
      iff = Builder::makeSequence(&local_40,(Expression *)iff,right);
    }
    *currp = (Expression *)iff;
    optimizeSetIf(wasm::Expression___(this,(Expression **)&(pNVar1->super_IString).str._M_str);
    bVar2 = true;
  }
  else {
LAB_00957474:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool optimizeSetIfWithCopyArm(Expression** currp) {
        auto* set = (*currp)->cast<LocalSet>();
        auto* iff = set->value->dynCast<If>();
        if (!iff || !iff->type.isConcrete() ||
            !iff->condition->type.isConcrete()) {
          return false;
        }
        Builder builder(*getModule());
        LocalGet* get = iff->ifTrue->dynCast<LocalGet>();
        if (get && get->index == set->index) {
          builder.flip(iff);
        } else {
          get = iff->ifFalse->dynCast<LocalGet>();
          if (get && get->index != set->index) {
            get = nullptr;
          }
        }
        if (!get) {
          return false;
        }
        // We can do it!
        bool tee = set->isTee();
        assert(set->index == get->index);
        assert(iff->ifFalse == get);
        set->value = iff->ifTrue;
        set->finalize();
        iff->ifTrue = set;
        iff->ifFalse = nullptr;
        iff->finalize();
        Expression* replacement = iff;
        if (tee) {
          set->makeSet();
          // We need a block too.
          replacement = builder.makeSequence(iff,
                                             get // reuse the get
          );
        }
        *currp = replacement;
        // Recurse on the set, which now has a new value.
        optimizeSetIf(&iff->ifTrue);
        return true;
      }